

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poppify.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_18::Poppifier::emitCatch(Poppifier *this,Try *curr,Index i)

{
  Expression **expr;
  Kind local_2c;
  reference local_28;
  value_type *scope;
  Try *pTStack_18;
  Index i_local;
  Try *curr_local;
  Poppifier *this_local;
  
  scope._4_4_ = i;
  pTStack_18 = curr;
  curr_local = (Try *)this;
  local_28 = std::
             vector<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
             ::back(&this->scopeStack);
  if (scope._4_4_ == 0) {
    if (local_28->kind != Try) {
      __assert_fail("scope.kind == Scope::Try",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Poppify.cpp"
                    ,0xff,"void wasm::(anonymous namespace)::Poppifier::emitCatch(Try *, Index)");
    }
    patchScope(this,&pTStack_18->body);
  }
  else {
    if (local_28->kind != Catch) {
      __assert_fail("scope.kind == Scope::Catch",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Poppify.cpp"
                    ,0x102,"void wasm::(anonymous namespace)::Poppifier::emitCatch(Try *, Index)");
    }
    expr = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                     (&(pTStack_18->catchBodies).
                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                      (ulong)(scope._4_4_ - 1));
    patchScope(this,expr);
  }
  local_2c = Catch;
  std::
  vector<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
  ::emplace_back<wasm::(anonymous_namespace)::Poppifier::Scope::Kind>(&this->scopeStack,&local_2c);
  return;
}

Assistant:

void Poppifier::emitCatch(Try* curr, Index i) {
  [[maybe_unused]] auto& scope = scopeStack.back();
  if (i == 0) {
    assert(scope.kind == Scope::Try);
    patchScope(curr->body);
  } else {
    assert(scope.kind == Scope::Catch);
    patchScope(curr->catchBodies[i - 1]);
  }
  scopeStack.emplace_back(Scope::Catch);
}